

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

S2Point * __thiscall
S2Loop::ProjectToBoundary(S2Point *__return_storage_ptr__,S2Loop *this,S2Point *x)

{
  VType VVar1;
  S2MinDistance SVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  Result RVar5;
  Edge edge;
  PointTarget target;
  Options local_378;
  S2Point local_360;
  Target local_348;
  VType local_340;
  VType VStack_338;
  VType local_330;
  S2ClosestEdgeQuery local_328;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_328,INFINITY);
  SVar2.super_S1ChordAngle.length2_ =
       (S1ChordAngle)(S1ChordAngle)local_328.options_.super_Options.max_distance_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_328,0.0);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_328,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_378,0.0);
  local_328.options_.super_Options.max_error_.length2_ =
       (double)local_378.max_distance_.super_S1ChordAngle.length2_;
  local_328.options_.super_Options.max_results_ = 0x7fffffff;
  local_328.options_.super_Options.include_interiors_ = true;
  local_328.options_.super_Options.use_brute_force_ = false;
  S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase(&local_328.base_);
  local_328.options_.super_Options.max_error_.length2_ =
       (double)local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_;
  local_328.options_.super_Options.max_results_ = 0x7fffffff;
  local_328.options_.super_Options.include_interiors_ = false;
  local_328.options_.super_Options.use_brute_force_ = false;
  local_328.base_.index_num_edges_ = 0;
  local_328.base_.index_num_edges_limit_ = 0;
  if (local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_ =
       (S1ChordAngle)(S1ChordAngle)SVar2;
  local_328.base_.index_ = &(this->index_).super_S2ShapeIndex;
  absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
  clear(&local_328.base_.index_cells_);
  local_340 = x->c_[0];
  VStack_338 = x->c_[1];
  local_330 = x->c_[2];
  local_348._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002c1ad8;
  local_378.max_distance_.super_S1ChordAngle.length2_ =
       local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_;
  local_378.max_error_.length2_ = local_328.options_.super_Options.max_error_.length2_;
  local_378._20_4_ =
       SUB84(CONCAT26(local_328.options_.super_Options._22_2_,
                      CONCAT24(local_328.options_.super_Options._20_2_,
                               local_328.options_.super_Options.max_results_)) >> 0x20,0);
  local_378.max_results_ = 1;
  RVar5 = S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge
                    (&local_328.base_,&local_348,&local_378);
  uVar4 = RVar5._8_8_;
  if ((long)uVar4 < 0) {
    __return_storage_ptr__->c_[2] = x->c_[2];
    VVar1 = x->c_[1];
    __return_storage_ptr__->c_[0] = x->c_[0];
    __return_storage_ptr__->c_[1] = VVar1;
  }
  else {
    iVar3 = (*((S2ShapeIndex *)&(local_328.base_.index_)->_vptr_S2ShapeIndex)->_vptr_S2ShapeIndex[3]
            )(RVar5.distance_.super_S1ChordAngle.length2_._0_4_,local_328.base_.index_,
              uVar4 & 0xffffffff);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
              (&local_378,(long *)CONCAT44(extraout_var,iVar3),uVar4 >> 0x20);
    S2::Project(__return_storage_ptr__,x,(S2Point *)&local_378,&local_360);
  }
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery(&local_328);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Loop::ProjectToBoundary(const S2Point& x) const {
  S2ClosestEdgeQuery::Options options;
  options.set_include_interiors(false);
  S2ClosestEdgeQuery q(&index_, options);
  S2ClosestEdgeQuery::PointTarget target(x);
  S2ClosestEdgeQuery::Result edge = q.FindClosestEdge(&target);
  return q.Project(x, edge);
}